

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate1<std::complex<double>_>::apply
          (QGate1<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  undefined8 *puVar1;
  complex<double> *pcVar2;
  complex<double> *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint __line;
  int iVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  char *__assertion;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int64_t k;
  ulong uVar20;
  bool bVar21;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  double in_XMM1_Qa;
  double dVar22;
  SquareMatrix<std::complex<double>_> mat1;
  complex<double> x1;
  complex<double> x2;
  SquareMatrix<std::complex<double>_> local_40;
  
  if (nbQubits < 1) {
    __assertion = "nbQubits >= 1";
    __line = 0x1f;
  }
  else {
    bVar11 = (byte)nbQubits;
    if (matrix->size_ == (long)(1 << (bVar11 & 0x1f))) {
      iVar8 = (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
      if (iVar8 + offset < nbQubits) {
        (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(&mat1,this);
        dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>(op,&mat1);
        bVar12 = (byte)(iVar8 + offset);
        if (side == Left) {
          if (nbQubits == 1) {
            dense::SquareMatrix<std::complex<double>_>::operator*=(matrix,&mat1);
          }
          else {
            lVar13 = (long)(1 << (~bVar12 + bVar11 & 0x1f));
            uVar15 = 0;
            lVar14 = 0;
            if (0 < lVar13) {
              lVar14 = lVar13;
            }
            uVar9 = (ulong)(uint)(1 << (bVar12 & 0x1f));
            if (1 << (bVar12 & 0x1f) < 1) {
              uVar9 = uVar15;
            }
            for (; (long)uVar15 < matrix->size_; uVar15 = uVar15 + 1) {
              lVar17 = 0;
              for (uVar20 = 0; lVar16 = lVar17, lVar18 = lVar14, uVar20 != uVar9;
                  uVar20 = uVar20 + 1) {
                while (bVar21 = lVar18 != 0, lVar18 = lVar18 + -1, bVar21) {
                  pcVar2 = (matrix->data_)._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  pcVar3 = pcVar2 + matrix->size_ * lVar16 + uVar15;
                  x1._M_value._0_8_ = *(undefined8 *)pcVar3->_M_value;
                  x1._M_value._8_8_ = *(undefined8 *)(pcVar3->_M_value + 8);
                  pcVar2 = pcVar2 + matrix->size_ * (lVar13 + lVar16) + uVar15;
                  x2._M_value._0_8_ = *(undefined8 *)pcVar2->_M_value;
                  x2._M_value._8_8_ = *(undefined8 *)(pcVar2->_M_value + 8);
                  std::operator*((complex<double> *)
                                 mat1.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl,
                                 &x1);
                  dVar22 = in_XMM1_Qa;
                  std::operator*((complex<double> *)
                                 ((long)mat1.data_._M_t.
                                        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                        .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                        _M_head_impl + 0x10),&x2);
                  auVar4._8_4_ = SUB84(dVar22 + in_XMM1_Qa,0);
                  auVar4._0_8_ = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) +
                                 (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                  auVar4._12_4_ = (int)((ulong)(dVar22 + in_XMM1_Qa) >> 0x20);
                  *(undefined1 (*) [16])
                   (matrix->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                   .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                   [matrix->size_ * lVar16 + uVar15]._M_value = auVar4;
                  std::operator*((complex<double> *)
                                 (mat1.size_ * 0x10 +
                                 (long)mat1.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                       .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl),&x1);
                  in_XMM1_Qa = dVar22;
                  std::operator*((complex<double> *)
                                 ((long)mat1.data_._M_t.
                                        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                        .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                        _M_head_impl + mat1.size_ * 0x10 + 0x10),&x2);
                  auVar5._8_4_ = SUB84(in_XMM1_Qa + dVar22,0);
                  auVar5._0_8_ = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02) +
                                 (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
                  auVar5._12_4_ = (int)((ulong)(in_XMM1_Qa + dVar22) >> 0x20);
                  *(undefined1 (*) [16])
                   (matrix->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                   .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                   [(lVar13 + lVar16) * matrix->size_ + uVar15]._M_value = auVar5;
                  lVar16 = lVar16 + 1;
                }
                lVar17 = lVar17 + lVar13 * 2;
              }
            }
          }
        }
        else if (nbQubits == 1) {
          dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_40,&mat1);
          dense::operator*((dense *)&x1,&local_40,matrix);
          dense::SquareMatrix<std::complex<double>_>::operator=
                    (matrix,(SquareMatrix<std::complex<double>_> *)&x1);
          std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
          ~unique_ptr((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
                       *)(x1._M_value + 8));
          std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
          ~unique_ptr(&local_40.data_);
        }
        else {
          lVar13 = (long)(1 << (~bVar12 + bVar11 & 0x1f));
          uVar15 = 0;
          lVar14 = 0;
          if (0 < lVar13) {
            lVar14 = lVar13;
          }
          uVar9 = (ulong)(uint)(1 << (bVar12 & 0x1f));
          if (1 << (bVar12 & 0x1f) < 1) {
            uVar9 = uVar15;
          }
          for (lVar17 = 0; lVar17 < matrix->size_; lVar17 = lVar17 + 1) {
            lVar16 = 0;
            for (uVar20 = 0; lVar18 = lVar16, lVar19 = lVar14, uVar20 != uVar9; uVar20 = uVar20 + 1)
            {
              while (bVar21 = lVar19 != 0, lVar19 = lVar19 + -1, bVar21) {
                lVar10 = matrix->size_ * uVar15;
                pcVar3 = (matrix->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                puVar1 = (undefined8 *)(pcVar3->_M_value + lVar18 + lVar10);
                x1._M_value._0_8_ = *puVar1;
                x1._M_value._8_8_ = puVar1[1];
                puVar1 = (undefined8 *)(pcVar3[lVar13]._M_value + lVar18 + lVar10);
                x2._M_value._0_8_ = *puVar1;
                x2._M_value._8_8_ = puVar1[1];
                std::operator*((complex<double> *)
                               mat1.data_._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl,
                               &x1);
                dVar22 = in_XMM1_Qa;
                std::operator*((complex<double> *)
                               (mat1.size_ * 0x10 +
                               (long)mat1.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl),&x2);
                auVar6._8_4_ = SUB84(dVar22 + in_XMM1_Qa,0);
                auVar6._0_8_ = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04) +
                               (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
                auVar6._12_4_ = (int)((ulong)(dVar22 + in_XMM1_Qa) >> 0x20);
                *(undefined1 (*) [16])
                 (((matrix->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                   .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value +
                 lVar18 + matrix->size_ * uVar15) = auVar6;
                std::operator*((complex<double> *)
                               ((long)mat1.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl + 0x10),&x1);
                in_XMM1_Qa = dVar22;
                std::operator*((complex<double> *)
                               ((long)mat1.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl + mat1.size_ * 0x10 + 0x10),&x2);
                auVar7._8_4_ = SUB84(in_XMM1_Qa + dVar22,0);
                auVar7._0_8_ = (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06) +
                               (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
                auVar7._12_4_ = (int)((ulong)(in_XMM1_Qa + dVar22) >> 0x20);
                *(undefined1 (*) [16])
                 ((matrix->data_)._M_t.
                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl[lVar13].
                  _M_value + lVar18 + matrix->size_ * uVar15) = auVar7;
                lVar18 = lVar18 + 0x10;
              }
              lVar16 = lVar16 + lVar13 * 0x20;
            }
            uVar15 = uVar15 + 0x10;
          }
        }
        std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
        ~unique_ptr(&mat1.data_);
        return;
      }
      __assertion = "qubit < nbQubits";
      __line = 0x22;
    }
    else {
      __assertion = "matrix.size() == 1 << nbQubits";
      __line = 0x20;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/src/qgates/QGate1.cpp"
                ,__line,
                "virtual void qclab::qgates::QGate1<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
               );
}

Assistant:

void QGate1< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 1 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit = this->qubit() + offset ;
    assert( qubit < nbQubits ) ;
    // operation
    qclab::dense::SquareMatrix< T >  mat1 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 1 ) {
        matrix *= mat1 ;
      } else {
        // matrix *= kron( Ileft , mat1 , Iright )
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 1 ) {
        matrix = mat1 * matrix ;
      } else {
        // matrix = kron( Ileft , mat1 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }